

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayoutPrivate::QGridLayoutPrivate(QGridLayoutPrivate *this)

{
  QLayoutPrivate::QLayoutPrivate(&this->super_QLayoutPrivate);
  *(undefined ***)&this->super_QLayoutPrivate = &PTR__QGridLayoutPrivate_007c06d0;
  (this->rowData).d.d = (Data *)0x0;
  (this->rowData).d.ptr = (QLayoutStruct *)0x0;
  (this->rowData).d.size = 0;
  (this->colData).d.d = (Data *)0x0;
  (this->colData).d.ptr = (QLayoutStruct *)0x0;
  (this->colData).d.size = 0;
  (this->rStretch).d.d = (Data *)0x0;
  (this->rStretch).d.ptr = (int *)0x0;
  (this->rStretch).d.size = 0;
  (this->cStretch).d.d = (Data *)0x0;
  (this->cStretch).d.ptr = (int *)0x0;
  (this->cStretch).d.size = 0;
  (this->rMinHeights).d.d = (Data *)0x0;
  (this->rMinHeights).d.ptr = (int *)0x0;
  (this->rMinHeights).d.size = 0;
  (this->cMinWidths).d.d = (Data *)0x0;
  (this->cMinWidths).d.ptr = (int *)0x0;
  (this->cMinWidths).d.size = 0;
  (this->things).d.d = (Data *)0x0;
  (this->things).d.ptr = (QGridBox **)0x0;
  (this->things).d.size = 0;
  this->hfw_width = -1;
  this->rr = 0;
  this->cc = 0;
  this->hfwData = (QList<QLayoutStruct> *)0x0;
  this->field_0x194 = this->field_0x194 & 0xe8 | 4;
  this->nextR = 0;
  this->nextC = 0;
  this->horizontalSpacing = -1;
  this->verticalSpacing = -1;
  return;
}

Assistant:

QGridLayoutPrivate::QGridLayoutPrivate()
{
    addVertical = false;
    setDirty();
    rr = cc = 0;
    nextR = nextC = 0;
    hfwData = nullptr;
    hReversed = false;
    vReversed = false;
    horizontalSpacing = -1;
    verticalSpacing = -1;
}